

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoofft.c
# Opt level: O3

CURLofft curlx_strtoofft(char *str,char **endp,int base,curl_off_t *num)

{
  byte bVar1;
  int iVar2;
  CURLofft CVar3;
  int *piVar4;
  long lVar5;
  char *end;
  char *local_30;
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  *num = 0;
  bVar1 = *str;
  do {
    if (bVar1 == 0) {
LAB_0012cc4d:
      lVar5 = strtol(str,&local_30,base);
      if (endp != (char **)0x0) {
        *endp = local_30;
      }
      CVar3 = CURL_OFFT_FLOW;
      if (*piVar4 != 0x22) {
        if (str == local_30) {
          CVar3 = CURL_OFFT_INVAL;
        }
        else {
          *num = lVar5;
          CVar3 = CURL_OFFT_OK;
        }
      }
      return CVar3;
    }
    iVar2 = Curl_isspace((uint)bVar1);
    if (iVar2 == 0) {
      if (*str == '-') {
        if (endp == (char **)0x0) {
          return CURL_OFFT_INVAL;
        }
        *endp = str;
        return CURL_OFFT_INVAL;
      }
      goto LAB_0012cc4d;
    }
    bVar1 = str[1];
    str = str + 1;
  } while( true );
}

Assistant:

CURLofft curlx_strtoofft(const char *str, char **endp, int base,
                         curl_off_t *num)
{
  char *end;
  curl_off_t number;
  errno = 0;
  *num = 0; /* clear by default */

  DEBUGASSERT(str);

  while(*str && ISSPACE(*str))
    str++;
  if('-' == *str) {
    if(endp)
      *endp = (char *)str; /* didn't actually move */
    return CURL_OFFT_INVAL; /* nothing parsed */
  }
  number = strtooff(str, &end, base);
  if(endp)
    *endp = end;
  if(errno == ERANGE)
    /* overflow/underflow */
    return CURL_OFFT_FLOW;
  else if(str == end)
    /* nothing parsed */
    return CURL_OFFT_INVAL;

  *num = number;
  return CURL_OFFT_OK;
}